

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  pointer pcVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  long lVar4;
  size_t sVar5;
  string value;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  undefined1 *local_58;
  pointer local_50 [2];
  undefined1 local_40 [16];
  
  local_50[0] = (str->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = local_50[0] + str->_M_string_length;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_58);
  str->_M_string_length = (long)local_58 - (long)(str->_M_dataplus)._M_p;
  *local_58 = 0;
  _Var3 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    ();
  pcVar1 = (str->_M_dataplus)._M_p;
  if (pcVar1 + str->_M_string_length == _Var3._M_current) {
    str->_M_string_length = 0;
    *pcVar1 = '\0';
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)str,0);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (str->_M_string_length != 0) {
    local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__;
    do {
      lVar4 = ::std::__cxx11::string::find(-0x60,(ulong)(uint)(int)*(str->_M_dataplus)._M_p);
      pcVar2 = (str->_M_dataplus)._M_p;
      if (lVar4 == -1) {
        _Var3 = ::std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>>
                          (pcVar2,pcVar2 + str->_M_string_length,delimiter);
        pcVar1 = (str->_M_dataplus)._M_p;
        if (_Var3._M_current == pcVar1 + str->_M_string_length) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,str);
          goto LAB_00126078;
        }
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)&local_80,pcVar1,_Var3._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_80);
        local_50[0] = local_40;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_50,_Var3._M_current + 1,
                   (str->_M_dataplus)._M_p + str->_M_string_length);
        ::std::__cxx11::string::operator=((string *)str,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        __return_storage_ptr__ =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      else {
        lVar4 = ::std::__cxx11::string::find(-0x60,(ulong)(uint)(int)*pcVar2);
        sVar5 = close_sequence(str,0,*(char *)(matchBracketChars_abi_cxx11_ + lVar4));
        if (sVar5 < str->_M_string_length) {
          ::std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          if (sVar5 + 2 < str->_M_string_length) {
            ::std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
            ::std::__cxx11::string::operator=((string *)str,(string *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p);
            }
            goto LAB_00126086;
          }
        }
        else {
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,str);
        }
LAB_00126078:
        str->_M_string_length = 0;
        *(str->_M_dataplus)._M_p = '\0';
      }
LAB_00126086:
      local_50[0] = (str->_M_dataplus)._M_p;
      local_80._M_dataplus._M_p = local_50[0] + str->_M_string_length;
      ::std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                (&local_58,&local_80,(string *)local_50);
      str->_M_string_length = (long)local_58 - (long)(str->_M_dataplus)._M_p;
      *local_58 = 0;
      _Var3 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                        ();
      pcVar1 = (str->_M_dataplus)._M_p;
      if (pcVar1 + str->_M_string_length == _Var3._M_current) {
        str->_M_string_length = 0;
        *pcVar1 = '\0';
      }
      else {
        ::std::__cxx11::string::_M_erase((ulong)str,0);
      }
    } while (str->_M_string_length != 0);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}